

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O0

Move * cuddZddSymmSifting_down(DdManager *table,int x,int x_high,int initial_size)

{
  uint uVar1;
  Move *pMVar2;
  int iVar3;
  DdNode *pDVar4;
  uint local_50;
  int gybot;
  int gxtop;
  int i;
  int limit_size;
  int size;
  int y;
  Move *move;
  Move *moves;
  int local_20;
  int initial_size_local;
  int x_high_local;
  int x_local;
  DdManager *table_local;
  
  move = (Move *)0x0;
  moves._4_4_ = initial_size;
  local_20 = x_high;
  initial_size_local = x;
  _x_high_local = table;
  limit_size = cuddZddNextHigh(table,x);
  gxtop = initial_size;
  do {
    if (local_20 < limit_size) {
      return move;
    }
    local_50 = _x_high_local->subtableZ[limit_size].next;
    while (_x_high_local->subtableZ[(int)local_50].next != limit_size) {
      local_50 = _x_high_local->subtableZ[(int)local_50].next;
    }
    iVar3 = cuddZddSymmCheck(_x_high_local,initial_size_local,limit_size);
    if (iVar3 == 0) {
      if ((_x_high_local->subtableZ[initial_size_local].next == initial_size_local) &&
         (_x_high_local->subtableZ[limit_size].next == limit_size)) {
        iVar3 = cuddZddSwapInPlace(_x_high_local,initial_size_local,limit_size);
        if ((iVar3 == 0) || (pDVar4 = cuddDynamicAllocNode(_x_high_local), pDVar4 == (DdNode *)0x0))
        {
          while (move != (Move *)0x0) {
            pMVar2 = move->next;
            move->y = 0;
            *(DdNode **)&move->flags = _x_high_local->nextFree;
            _x_high_local->nextFree = (DdNode *)move;
            move = pMVar2;
          }
          return (Move *)0x1;
        }
        pDVar4->index = initial_size_local;
        pDVar4->ref = limit_size;
        *(int *)((long)&pDVar4->next + 4) = iVar3;
        (pDVar4->type).kids.T = (DdNode *)move;
        if ((double)gxtop * _x_high_local->maxGrowth < (double)iVar3) {
          return (Move *)pDVar4;
        }
        if (iVar3 < gxtop) {
          gxtop = iVar3;
        }
        initial_size_local = limit_size;
        move = (Move *)pDVar4;
        cuddZddNextHigh(_x_high_local,limit_size);
      }
      else {
        iVar3 = zdd_group_move(_x_high_local,initial_size_local,limit_size,&move);
        if ((double)gxtop * _x_high_local->maxGrowth < (double)iVar3) {
          return move;
        }
        if (iVar3 < gxtop) {
          gxtop = iVar3;
        }
      }
    }
    else {
      uVar1 = _x_high_local->subtableZ[initial_size_local].next;
      _x_high_local->subtableZ[initial_size_local].next = limit_size;
      gybot = _x_high_local->subtableZ[limit_size].next;
      while (_x_high_local->subtableZ[gybot].next != limit_size) {
        gybot = _x_high_local->subtableZ[gybot].next;
      }
      _x_high_local->subtableZ[gybot].next = uVar1;
    }
    initial_size_local = local_50;
    limit_size = cuddZddNextHigh(_x_high_local,local_50);
  } while( true );
}

Assistant:

static Move *
cuddZddSymmSifting_down(
  DdManager * table,
  int  x,
  int  x_high,
  int  initial_size)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size;
    int         limit_size = initial_size;
    int         i, gxtop, gybot;

    moves = NULL;
    y = cuddZddNextHigh(table, x);
    while (y <= x_high) {
        gybot = table->subtableZ[y].next;
        while (table->subtableZ[gybot].next != (unsigned) y)
            gybot = table->subtableZ[gybot].next;
        if (cuddZddSymmCheck(table, x, y)) {
            /* Symmetry found, attach symm groups */
            gxtop = table->subtableZ[x].next;
            table->subtableZ[x].next = y;
            i = table->subtableZ[y].next;
            while (table->subtableZ[i].next != (unsigned) y)
                i = table->subtableZ[i].next;
            table->subtableZ[i].next = gxtop;
        }
        else if ((table->subtableZ[x].next == (unsigned) x) &&
            (table->subtableZ[y].next == (unsigned) y)) {
            /* x and y have self symmetry */
            size = cuddZddSwapInPlace(table, x, y);
            if (size == 0)
                goto cuddZddSymmSifting_downOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL)
                goto cuddZddSymmSifting_downOutOfMem;
            move->x = x;
            move->y = y;
            move->size = size;
            move->next = moves;
            moves = move;
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
            x = y;
            y = cuddZddNextHigh(table, x);
        }
        else { /* Group move */
            size = zdd_group_move(table, x, y, &moves);
            if ((double)size >
                (double)limit_size * table->maxGrowth)
                return(moves);
            if (size < limit_size)
                limit_size = size;
        }
        x = gybot;
        y = cuddZddNextHigh(table, x);
    }

    return(moves);

cuddZddSymmSifting_downOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return(ZDD_MV_OOM);

}